

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
::GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint64 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  pointer pQVar7;
  Rep *pRVar8;
  ulong uVar9;
  long lVar10;
  Allocation new_allocation;
  
  uVar3 = (this->allocator_and_tag_).tag_.size_;
  uVar9 = uVar3 >> 1;
  if ((uVar3 & 1) == 0) {
    uVar6 = 0x10;
  }
  else {
    uVar6 = *(ulong *)&this->rep_;
  }
  if (uVar9 == uVar6) {
    pQVar7 = std::
             allocator_traits<std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>::
             allocate((allocator_type *)this,uVar3 & 0xfffffffffffffffe);
    pQVar7[uVar9].index_cell = args->index_cell;
    uVar4 = (args->id).id_;
    pQVar7[uVar9].distance.distance_.length2_ = (args->distance).distance_.length2_;
    pQVar7[uVar9].id.id_ = uVar4;
    if (((this->allocator_and_tag_).tag_.size_ & 1) == 0) {
      pRVar8 = &this->rep_;
    }
    else {
      pRVar8 = *(Rep **)((long)&this->rep_ + 8);
    }
    for (lVar10 = 0; uVar9 * 0x18 - lVar10 != 0; lVar10 = lVar10 + 0x18) {
      puVar1 = (undefined8 *)((long)pRVar8 + lVar10);
      puVar2 = (undefined8 *)((long)&(pQVar7->distance).distance_.length2_ + lVar10);
      puVar2[2] = puVar1[2];
      uVar5 = puVar1[1];
      *puVar2 = *puVar1;
      puVar2[1] = uVar5;
    }
    new_allocation.buffer_ = pQVar7;
    new_allocation.capacity_ = uVar3 & 0xfffffffffffffffe;
    ResetAllocation(this,new_allocation,uVar9 + 1);
    return pQVar7 + uVar9;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::GrowAndEmplaceBack(Args &&...) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }